

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O2

void __thiscall
chrono::ChFrame<double>::TransformLocalToParent
          (ChFrame<double> *this,ChFrame<double> *local,ChFrame<double> *parent)

{
  ChVector<double> local_60;
  ChQuaternion<double> local_48;
  
  TransformLocalToParent(&local_60,this,&(local->coord).pos);
  ChQuaternion<double>::operator%(&local_48,&(this->coord).rot,&(local->coord).rot);
  SetCoord(parent,&local_60,&local_48);
  return;
}

Assistant:

void TransformLocalToParent(
        const ChFrame<Real>& local,  ///< frame to transform, given in local frame coordinates
        ChFrame<Real>& parent        ///< transformed frame, in parent coordinates, will be stored here
        ) const {
        parent.SetCoord(TransformLocalToParent(local.coord.pos), coord.rot % local.coord.rot);
    }